

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CATNNode<char> *
std::__uninitialized_copy<false>::
__uninit_copy<Centaurus::CATNNode<char>const*,Centaurus::CATNNode<char>*>
          (CATNNode<char> *__first,CATNNode<char> *__last,CATNNode<char> *__result)

{
  for (; __first != __last; __first = __first + 1) {
    Centaurus::CATNNode<char>::CATNNode(__result,__first);
    __result = __result + 1;
  }
  return __result;
}

Assistant:

CharClass(wchar_t start, wchar_t end)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(start, end));
    }